

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::~IfcComplexProperty
          (IfcComplexProperty *this,void **vtt)

{
  void **vtt_local;
  IfcComplexProperty *this_local;
  
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
            + (long)(this->super_IfcProperty).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>._vptr_ObjectHelper
                    [-3]) = vtt[7];
  *(void **)&(this->super_IfcProperty).field_0x58 = vtt[8];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>::~ListOf
            (&this->HasProperties);
  std::__cxx11::string::~string((string *)&(this->super_IfcProperty).field_0x68);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcComplexProperty,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcComplexProperty,_2UL> *)
             &(this->super_IfcProperty).field_0x58,vtt + 5);
  IfcProperty::~IfcProperty(&this->super_IfcProperty,vtt + 1);
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}